

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qabstractscrollarea.cpp
# Opt level: O2

QPoint __thiscall QAbstractScrollAreaPrivate::contentsOffset(QAbstractScrollAreaPrivate *this)

{
  QWidget *this_00;
  bool bVar1;
  uint uVar2;
  int iVar3;
  int iVar4;
  ulong uVar5;
  uint uVar6;
  
  this_00 = *(QWidget **)&(this->super_QFramePrivate).super_QWidgetPrivate.field_0x8;
  uVar6 = 0;
  if ((((this->vbar->super_QAbstractSlider).super_QWidget.data)->widget_attributes & 0x8000) == 0) {
    uVar5 = 0;
  }
  else {
    uVar2 = QAbstractSlider::value(&this->vbar->super_QAbstractSlider);
    uVar5 = (ulong)uVar2 << 0x20;
  }
  if ((((this->hbar->super_QAbstractSlider).super_QWidget.data)->widget_attributes & 0x8000) != 0) {
    bVar1 = QWidget::isRightToLeft(this_00);
    if (bVar1) {
      iVar3 = QAbstractSlider::maximum(&this->hbar->super_QAbstractSlider);
      iVar4 = QAbstractSlider::value(&this->hbar->super_QAbstractSlider);
      uVar6 = iVar3 - iVar4;
    }
    else {
      uVar6 = QAbstractSlider::value(&this->hbar->super_QAbstractSlider);
    }
  }
  return (QPoint)(uVar5 | uVar6);
}

Assistant:

QPoint QAbstractScrollAreaPrivate::contentsOffset() const
{
    Q_Q(const QAbstractScrollArea);
    QPoint offset;
    if (vbar->isVisible())
        offset.setY(vbar->value());
    if (hbar->isVisible()) {
        if (q->isRightToLeft())
            offset.setX(hbar->maximum() - hbar->value());
        else
            offset.setX(hbar->value());
    }
    return offset;
}